

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O0

Abc_Cex_t * Bmc_CexCareTotal(Abc_Cex_t **pCexes,int nCexes)

{
  int iVar1;
  Abc_Cex_t *pAVar2;
  Abc_Cex_t *pCexMin;
  int nWords;
  int k;
  int i;
  int nCexes_local;
  Abc_Cex_t **pCexes_local;
  
  iVar1 = Abc_BitWordNum((*pCexes)->nBits);
  pAVar2 = Abc_CexAlloc((*pCexes)->nRegs,(*pCexes)->nPis,(*pCexes)->iFrame + 1);
  pAVar2->iPo = (*pCexes)->iPo;
  pAVar2->iFrame = (*pCexes)->iFrame;
  for (nWords = 0; nWords < iVar1; nWords = nWords + 1) {
    (&pAVar2[1].iPo)[nWords] = (&(*pCexes)[1].iPo)[nWords];
    for (pCexMin._4_4_ = 1; pCexMin._4_4_ < nCexes; pCexMin._4_4_ = pCexMin._4_4_ + 1) {
      (&pAVar2[1].iPo)[nWords] = (&pCexes[pCexMin._4_4_][1].iPo)[nWords] & (&pAVar2[1].iPo)[nWords];
    }
  }
  return pAVar2;
}

Assistant:

Abc_Cex_t * Bmc_CexCareTotal( Abc_Cex_t ** pCexes, int nCexes )
{
    int i, k, nWords = Abc_BitWordNum( pCexes[0]->nBits );
    Abc_Cex_t * pCexMin = Abc_CexAlloc( pCexes[0]->nRegs, pCexes[0]->nPis, pCexes[0]->iFrame + 1 );
    pCexMin->iPo    = pCexes[0]->iPo;
    pCexMin->iFrame = pCexes[0]->iFrame;
    for ( i = 0; i < nWords; i++ )
    {
        pCexMin->pData[i] = pCexes[0]->pData[i];
        for ( k = 1; k < nCexes; k++ )
            pCexMin->pData[i] &= pCexes[k]->pData[i];
    }
    return pCexMin;
}